

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O2

void __thiscall cs::repl::exec(repl *this,string *code)

{
  char cVar1;
  pointer pcVar2;
  size_type sVar3;
  size_t sVar4;
  bool bVar5;
  int iVar6;
  long lVar7;
  exception *peVar8;
  int iVar9;
  size_type sVar10;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  string line;
  int code_1;
  string cmd;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  string local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  this->line_num = this->line_num + 1;
  pcVar2 = (code->_M_dataplus)._M_p;
  sVar3 = code->_M_string_length;
  iVar9 = 0;
  for (sVar10 = 0; sVar3 != sVar10; sVar10 = sVar10 + 1) {
    if (iVar9 == 1) {
      iVar6 = isspace((int)pcVar2[sVar10]);
      iVar9 = 1;
      if (iVar6 == 0) {
        std::__cxx11::string::push_back((char)&this->cmd_buff);
        iVar9 = 1;
      }
    }
    else {
      if (iVar9 != 0) goto LAB_0014e97a;
      cVar1 = pcVar2[sVar10];
      iVar6 = isspace((int)cVar1);
      iVar9 = 0;
      if (iVar6 == 0) {
        iVar9 = 1;
        if (cVar1 != '@') {
          if (cVar1 == '#') {
            std::
            deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::emplace_back<>(&((this->context).
                               super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr)->file_buff);
            return;
          }
          iVar9 = -1;
        }
      }
    }
  }
  if (iVar9 != 0) {
    if (iVar9 != 1) {
LAB_0014e97a:
      this_00 = &((this->context).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->file_buff;
      if (this->multi_line == true) {
        std::
        deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::emplace_back<>(this_00);
        std::__cxx11::string::append((string *)&this->line_buff);
        return;
      }
      std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string_const&>
                ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,code);
      run(this,code);
      return;
    }
    cmd._M_dataplus._M_p = (pointer)&cmd.field_2;
    cmd._M_string_length = 0;
    cmd.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::swap((string *)&this->cmd_buff);
    bVar5 = std::operator==(&cmd,"begin");
    if ((bVar5) && (this->multi_line == false)) {
      this->multi_line = true;
      std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::emplace_back<>(&((this->context).
                         super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                        file_buff);
    }
    else {
      bVar5 = std::operator==(&cmd,"end");
      if ((bVar5) && (this->multi_line == true)) {
        this->multi_line = false;
        line._M_dataplus._M_p = (pointer)&line.field_2;
        line._M_string_length = 0;
        line.field_2._M_local_buf[0] = '\0';
        std::__cxx11::string::swap((string *)&this->line_buff);
        run(this,&line);
      }
      else {
        lVar7 = std::__cxx11::string::find((char)&cmd,0x3a);
        line._M_dataplus._M_p = (pointer)&line.field_2;
        line._M_string_length = 0;
        line.field_2._M_local_buf[0] = '\0';
        if (lVar7 != -1) {
          std::__cxx11::string::substr((ulong)&code_1,(ulong)&cmd);
          std::__cxx11::string::operator=((string *)&line,(string *)&code_1);
          std::__cxx11::string::~string((string *)&code_1);
          std::__cxx11::string::substr((ulong)&code_1,(ulong)&cmd);
          std::__cxx11::string::operator=((string *)&cmd,(string *)&code_1);
          std::__cxx11::string::~string((string *)&code_1);
        }
        bVar5 = std::operator==(&cmd,"exit");
        if (bVar5) {
          code_1 = 0;
          event_type::touch((event_type *)(current_process + 0xa8),&code_1);
        }
        else {
          bVar5 = std::operator==(&cmd,"charset");
          if (bVar5) {
            bVar5 = std::operator==(&line,"ascii");
            if (bVar5) {
              this->encoding = ascii;
            }
            else {
              bVar5 = std::operator==(&line,"utf8");
              if (bVar5) {
                this->encoding = utf8;
              }
              else {
                bVar5 = std::operator==(&line,"gbk");
                if (!bVar5) {
                  peVar8 = (exception *)__cxa_allocate_exception(0x90);
                  sVar4 = this->line_num;
                  std::__cxx11::string::string
                            ((string *)&local_50,
                             (string *)
                             &((this->context).
                               super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr)->file_path);
                  std::operator+(&local_1d0,"@",&cmd);
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&code_1,&local_1d0,": ");
                  std::operator+(&local_70,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&code_1,&line);
                  std::__cxx11::string::string
                            ((string *)&local_90,"Unavailable encoding.",(allocator *)&local_1b0);
                  exception::exception(peVar8,sVar4,&local_50,&local_70,&local_90);
                  __cxa_throw(peVar8,&exception::typeinfo,exception::~exception);
                }
                this->encoding = gbk;
              }
            }
          }
          else {
            bVar5 = std::operator==(&cmd,"require");
            if (!bVar5) {
              peVar8 = (exception *)__cxa_allocate_exception(0x90);
              sVar4 = this->line_num;
              std::__cxx11::string::string
                        ((string *)&local_130,
                         (string *)
                         &((this->context).
                           super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                          ->file_path);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &code_1,"@",&cmd);
              if (line._M_string_length == 0) {
                std::__cxx11::string::string((string *)&local_1d0,"",(allocator *)&local_1b0);
              }
              else {
                std::operator+(&local_1d0,": ",&line);
              }
              std::operator+(&local_150,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &code_1,&local_1d0);
              std::__cxx11::string::string
                        ((string *)&local_170,"Wrong grammar for preprocessor command.",
                         (allocator *)&local_190);
              exception::exception(peVar8,sVar4,&local_130,&local_150,&local_170);
              __cxa_throw(peVar8,&exception::typeinfo,exception::~exception);
            }
            std::__cxx11::string::string((string *)&code_1,"210508",(allocator *)&local_1d0);
            bVar5 = std::operator>(&line,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&code_1);
            if (bVar5) {
              peVar8 = (exception *)__cxa_allocate_exception(0x90);
              sVar4 = this->line_num;
              std::__cxx11::string::string
                        ((string *)&local_b0,
                         (string *)
                         &((this->context).
                           super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                          ->file_path);
              std::operator+(&local_1b0,"@",&cmd);
              std::operator+(&local_1d0,&local_1b0,": ");
              std::operator+(&local_d0,&local_1d0,&line);
              std::operator+(&local_110,"Newer Language Standard required: ",&line);
              std::operator+(&local_190,&local_110,", now on ");
              std::operator+(&local_f0,&local_190,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &code_1);
              exception::exception(peVar8,sVar4,&local_b0,&local_d0,&local_f0);
              __cxa_throw(peVar8,&exception::typeinfo,exception::~exception);
            }
            std::__cxx11::string::~string((string *)&code_1);
          }
        }
        std::
        deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::emplace_back<>(&((this->context).
                           super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                          ->file_buff);
      }
      std::__cxx11::string::~string((string *)&line);
    }
    std::__cxx11::string::~string((string *)&cmd);
  }
  return;
}

Assistant:

void repl::exec(const string &code)
	{
		// Preprocess
		++line_num;
		int mode = 0;
		for (auto &ch: code) {
			if (mode == 0) {
				if (!std::isspace(ch)) {
					switch (ch) {
					case '#':
						context->file_buff.emplace_back();
						return;
					case '@':
						mode = 1;
						break;
					default:
						mode = -1;
					}
				}
			}
			else if (mode == 1) {
				if (!std::isspace(ch))
					cmd_buff.push_back(ch);
			}
			else
				break;
		}
		switch (mode) {
		default:
			break;
		case 0:
			return;
		case 1: {
			std::string cmd;
			std::swap(cmd_buff, cmd);
			if (cmd == "begin" && !multi_line) {
				multi_line = true;
				context->file_buff.emplace_back();
			}
			else if (cmd == "end" && multi_line) {
				multi_line = false;
				std::string line;
				std::swap(line_buff, line);
				this->run(line);
			}
			else {
				auto pos = cmd.find(':');
				std::string arg;
				if (pos != std::string::npos) {
					arg = cmd.substr(pos + 1);
					cmd = cmd.substr(0, pos);
				}
				if (cmd == "exit") {
					int code = 0;
					current_process->on_process_exit.touch(&code);
				}
				else if (cmd == "charset") {
					if (arg == "ascii")
						encoding = charset::ascii;
					else if (arg == "utf8")
						encoding = charset::utf8;
					else if (arg == "gbk")
						encoding = charset::gbk;
					else
						throw exception(line_num, context->file_path, "@" + cmd + ": " + arg,
						                "Unavailable encoding.");
				}
				else if (cmd == "require") {
					std::string version_str = CS_GET_VERSION_STR(COVSCRIPT_STD_VERSION);
					if (arg > version_str)
						throw exception(line_num, context->file_path, "@" + cmd + ": " + arg,
						                "Newer Language Standard required: " + arg + ", now on " + version_str);
				}
				else
					throw exception(line_num, context->file_path, "@" + cmd + (arg.empty() ? "" : ": " + arg),
					                "Wrong grammar for preprocessor command.");
				context->file_buff.emplace_back();
			}
			return;
		}
		}
		if (multi_line) {
			context->file_buff.emplace_back();
			line_buff.append(code);
		}
		else {
			context->file_buff.emplace_back(code);
			this->run(code);
		}
	}